

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::SwitchStmt::SwitchStmt(SwitchStmt *this,Var *target)

{
  initializer_list<kratos::IRNode_*> __l;
  bool signed_;
  VarType VVar1;
  uint32_t width;
  element_type *var;
  element_type *peVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar3 [16];
  format_args args;
  string_view format_str;
  undefined1 local_128 [16];
  undefined1 local_118 [24];
  SwitchStmt *local_100;
  Var *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_f0;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined8 local_98;
  Var *target_local;
  SwitchStmt *this_local;
  undefined1 local_80 [16];
  pointer local_70;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68 [2];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  pointer local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  _Base_ptr local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  _Base_ptr local_18;
  __node_base local_10;
  
  local_98 = target;
  target_local = (Var *)this;
  Stmt::Stmt(&this->super_Stmt,Switch);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_0058daf8;
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)&this->target_);
  std::shared_ptr<kratos::AssignStmt>::shared_ptr(&this->target_stmt_);
  std::
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  ::map(&this->body_);
  VVar1 = Var::type((Var *)local_98);
  if (VVar1 == ConstValue) {
    local_118[0x16] = 1;
    auVar3 = __cxa_allocate_exception(0x10);
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_98 + 0x78);
    local_38 = &local_c8;
    local_40 = (pointer)0x423d93;
    local_68[0]._0_8_ =
         fmt::v7::make_args_checked<std::__cxx11::string&,char[40],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"switch target cannot be const value {0}",(v7 *)vargs,auVar3._8_8_,
                    (remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                    "switch target cannot be const value {0}");
    local_68[1]._8_8_ = local_68;
    join_0x00000010_0x00000000_ = fmt::v7::to_string_view<char,_0>((char *)local_40);
    local_28 = (_Base_ptr)&this_local;
    local_30 = (anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
                *)local_68[1]._8_8_;
    local_20 = (anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
                *)local_68[1]._8_8_;
    local_10._M_nxt = (_Hash_node_base *)local_68[1]._8_8_;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_28,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_68[1]._8_8_);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = local_80._0_8_;
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_70;
    fmt::v7::detail::vformat_abi_cxx11_(&local_c8,(detail *)local_80._8_8_,format_str,args);
    local_f8 = (Var *)local_98;
    local_f0._M_allocated_capacity = (size_type)&local_100;
    local_f0._8_8_ = 2;
    local_100 = this;
    std::allocator<kratos::IRNode_*>::allocator((allocator<kratos::IRNode_*> *)(local_118 + 0x17));
    __l._M_len = local_f0._8_8_;
    __l._M_array = (iterator)local_f0._M_allocated_capacity;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_e0,__l,(allocator<kratos::IRNode_*> *)(local_118 + 0x17));
    StmtException::StmtException(auVar3._0_8_,&local_c8,&local_e0);
    local_118[0x16] = 0;
    __cxa_throw(auVar3._0_8_,&StmtException::typeinfo,StmtException::~StmtException);
  }
  width = (**(code **)(*(long *)local_98 + 0x68))();
  signed_ = (bool)(**(code **)(*(long *)local_98 + 0x38))();
  Generator::get_auxiliary_var((Generator *)local_128,width,signed_);
  var = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   local_128);
  Var::assign((Var *)local_118,var);
  std::shared_ptr<kratos::AssignStmt>::operator=
            (&this->target_stmt_,(shared_ptr<kratos::AssignStmt> *)local_118);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_118);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_128);
  peVar2 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->target_stmt_);
  (*(peVar2->super_Stmt).super_IRNode._vptr_IRNode[7])(peVar2,this);
  return;
}

Assistant:

SwitchStmt::SwitchStmt(Var &target)
    : Stmt(StatementType::Switch), target_(target.shared_from_this()) {
    // we don't allow const target
    if (target.type() == VarType::ConstValue)
        throw StmtException(::format("switch target cannot be const value {0}", target.name),
                            {this, &target});

    // just to add the sinks
    target_stmt_ = target.generator()->get_auxiliary_var(target.width())->assign(target);
    target_stmt_->set_parent(this);
}